

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_35(QPDF *pdf,char *arg2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *this;
  long lVar4;
  long lVar5;
  char *pcVar6;
  unsigned_long uVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  size_type sVar10;
  size_t i;
  ulong uVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar12;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  string t;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  QPDFObjectHandle stream;
  string local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  QPDFObjectHandle names;
  string local_f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  QPDFObjectHandle embeddedFiles;
  QPDFObjectHandle root;
  string local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFObjectHandle item;
  string local_80 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  attachments;
  
  attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &attachments._M_t._M_impl.super__Rb_tree_header._M_header;
  attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  attachments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/Names",(allocator<char> *)&t);
  QPDFObjectHandle::getKey((string *)&names);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/EmbeddedFiles",(allocator<char> *)&t);
  QPDFObjectHandle::getKey((string *)&embeddedFiles);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"/Names",(allocator<char> *)&local_180);
  QPDFObjectHandle::getKey((string *)&t);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&names,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t._M_string_length);
  std::__cxx11::string::~string((string *)&filename);
  iVar12 = 0;
  do {
    iVar3 = QPDFObjectHandle::getArrayNItems();
    if (iVar3 <= iVar12) {
      p_Var9 = attachments._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((_Rb_tree_header *)p_Var9 == &attachments._M_t._M_impl.super__Rb_tree_header) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&embeddedFiles.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&names.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&root.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
          ::~_Rb_tree(&attachments._M_t);
          return;
        }
        lVar4 = Buffer::getBuffer();
        lVar5 = Buffer::getSize();
        filename._M_dataplus._M_p = (pointer)&filename.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&filename,lVar4,lVar5 + lVar4);
        uVar11 = 0;
        do {
          if (filename._M_string_length <= uVar11) goto LAB_0011d624;
          pcVar6 = (char *)std::__cxx11::string::at((ulong)&filename);
          if (*pcVar6 < '\0') break;
          pcVar6 = (char *)std::__cxx11::string::at((ulong)&filename);
          uVar11 = uVar11 + 1;
        } while (*pcVar6 != '\x7f');
        t._M_dataplus._M_p = (pointer)&t.field_2;
        t._M_string_length = 0;
        t.field_2._M_local_buf[0] = '\0';
        uVar11 = 0;
        while( true ) {
          sVar10 = filename._M_string_length;
          local_180._M_dataplus._M_p._0_4_ = 0x14;
          uVar7 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert((int *)&local_180);
          if (uVar7 < sVar10) {
            sVar10 = uVar7;
          }
          if (sVar10 <= uVar11) break;
          pcVar6 = (char *)std::__cxx11::string::at((ulong)&filename);
          if (*pcVar6 < ' ') {
LAB_0011d573:
            std::__cxx11::string::append((char *)&t);
          }
          else {
            pcVar6 = (char *)std::__cxx11::string::at((ulong)&filename);
            if (*pcVar6 == '\x7f') goto LAB_0011d573;
            std::__cxx11::string::at((ulong)&filename);
            std::__cxx11::string::push_back((char)&t);
          }
          uVar11 = uVar11 + 1;
        }
        QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_160,(int)filename._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                       " (",&local_160);
        std::operator+(&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                       " bytes)");
        std::__cxx11::string::append((string *)&t);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&stream);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::_M_assign((string *)&filename);
        std::__cxx11::string::~string((string *)&t);
LAB_0011d624:
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)(p_Var9 + 1));
        poVar8 = std::operator<<(poVar8,":\n");
        poVar8 = std::operator<<(poVar8,(string *)&filename);
        std::operator<<(poVar8,"--END--\n");
        std::__cxx11::string::~string((string *)&filename);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while( true );
    }
    QPDFObjectHandle::getArrayItem((int)&item);
    cVar1 = QPDFObjectHandle::isDictionary();
    if (cVar1 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&filename,"/Type",&local_1c1);
      QPDFObjectHandle::getKey(local_120);
      cVar1 = QPDFObjectHandle::isName();
      if (cVar1 == '\0') {
        this_00 = &local_118;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"/Type",&local_1c2);
        QPDFObjectHandle::getKey(local_a0);
        QPDFObjectHandle::getName_abi_cxx11_();
        bVar2 = std::operator==(&t,"/Filespec");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&stream,"/EF",&local_1c3);
          QPDFObjectHandle::getKey(local_b0);
          cVar1 = QPDFObjectHandle::isDictionary();
          if (cVar1 == '\0') {
            cVar1 = '\0';
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_160,"/EF",&local_1c4);
            QPDFObjectHandle::getKey(local_f0);
            std::__cxx11::string::string<std::allocator<char>>(local_80,"/F",&local_1c5);
            QPDFObjectHandle::getKey(local_c0);
            cVar1 = QPDFObjectHandle::isStream();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8);
            std::__cxx11::string::~string(local_80);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
            std::__cxx11::string::~string((string *)&local_160);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
          std::__cxx11::string::~string((string *)&stream);
        }
        else {
          cVar1 = '\0';
        }
        std::__cxx11::string::~string((string *)&t);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
        std::__cxx11::string::~string((string *)&local_180);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118);
        std::__cxx11::string::~string((string *)&filename);
        if (cVar1 == '\0') goto LAB_0011d46a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t,"/F",(allocator<char> *)&stream);
        QPDFObjectHandle::getKey((string *)&local_180);
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_180._M_string_length);
        std::__cxx11::string::~string((string *)&t);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t,"/EF",(allocator<char> *)local_80);
        QPDFObjectHandle::getKey((string *)&local_160);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"/F",(allocator<char> *)local_120);
        QPDFObjectHandle::getKey((string *)&stream);
        std::__cxx11::string::~string((string *)&local_180);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_160._M_string_length);
        std::__cxx11::string::~string((string *)&t);
        QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&t);
        this = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                ::operator[](&attachments,&filename)->
                super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this,(__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&t);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&t._M_string_length);
        this_00 = &stream.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      std::__cxx11::string::~string((string *)&filename);
    }
LAB_0011d46a:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

static void
test_35(QPDF& pdf, char const* arg2)
{
    // Extract attachments

    std::map<std::string, std::shared_ptr<Buffer>> attachments;
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle names = root.getKey("/Names");
    QPDFObjectHandle embeddedFiles = names.getKey("/EmbeddedFiles");
    names = embeddedFiles.getKey("/Names");
    for (int i = 0; i < names.getArrayNItems(); ++i) {
        QPDFObjectHandle item = names.getArrayItem(i);
        if (item.isDictionary() && item.getKey("/Type").isName() &&
            (item.getKey("/Type").getName() == "/Filespec") && item.getKey("/EF").isDictionary() &&
            item.getKey("/EF").getKey("/F").isStream()) {
            std::string filename = item.getKey("/F").getStringValue();
            QPDFObjectHandle stream = item.getKey("/EF").getKey("/F");
            attachments[filename] = stream.getStreamData();
        }
    }
    for (auto const& iter: attachments) {
        std::string const& filename = iter.first;
        std::string data = std::string(
            reinterpret_cast<char const*>(iter.second->getBuffer()), iter.second->getSize());
        bool is_binary = false;
        for (size_t i = 0; i < data.size(); ++i) {
            if ((data.at(i) < 0) || (data.at(i) > 126)) {
                is_binary = true;
                break;
            }
        }
        if (is_binary) {
            std::string t;
            for (size_t i = 0; i < std::min(data.size(), QIntC::to_size(20)); ++i) {
                if ((data.at(i) >= 32) && (data.at(i) <= 126)) {
                    t += data.at(i);
                } else {
                    t += ".";
                }
            }
            t += " (" + QUtil::uint_to_string(data.size()) + " bytes)";
            data = t;
        }
        std::cout << filename << ":\n" << data << "--END--\n";
    }
}